

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O2

zlib_table * zlib_mktable(uchar *lengths,int nlengths)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  zlib_table *pzVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int startcode [16];
  int count [16];
  int codes [288];
  
  for (lVar2 = 1; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    count[lVar2] = 0;
  }
  uVar6 = 0;
  uVar3 = 0;
  if (0 < nlengths) {
    uVar3 = (ulong)(uint)nlengths;
  }
  uVar5 = 0;
  for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    bVar1 = lengths[uVar6];
    count[bVar1] = count[bVar1] + 1;
    uVar9 = (uint)bVar1;
    if (bVar1 < uVar5) {
      uVar9 = uVar5;
    }
    uVar5 = uVar9;
  }
  iVar10 = 0;
  for (lVar2 = 1; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    startcode[lVar2] = iVar10;
    iVar10 = (iVar10 + count[lVar2]) * 2;
  }
  for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    uVar8 = (ulong)lengths[uVar6];
    uVar9 = startcode[uVar8];
    startcode[uVar8] = uVar9 + 1;
    codes[uVar6] = 0;
    iVar10 = 0;
    while (iVar7 = (int)uVar8, uVar8 = (ulong)(iVar7 - 1), iVar7 != 0) {
      iVar10 = (uVar9 & 1) + iVar10 * 2;
      codes[uVar6] = iVar10;
      uVar9 = (int)uVar9 >> 1;
    }
  }
  uVar9 = 9;
  if (uVar5 < 9) {
    uVar9 = uVar5;
  }
  pzVar4 = zlib_mkonetab(codes,lengths,nlengths,0,0,uVar9);
  return pzVar4;
}

Assistant:

static struct zlib_table *zlib_mktable(unsigned char *lengths,
                                       int nlengths)
{
    int count[MAXCODELEN], startcode[MAXCODELEN], codes[MAXSYMS];
    int code, maxlen;
    int i, j;

    /* Count the codes of each length. */
    maxlen = 0;
    for (i = 1; i < MAXCODELEN; i++)
        count[i] = 0;
    for (i = 0; i < nlengths; i++) {
        count[lengths[i]]++;
        if (maxlen < lengths[i])
            maxlen = lengths[i];
    }
    /* Determine the starting code for each length block. */
    code = 0;
    for (i = 1; i < MAXCODELEN; i++) {
        startcode[i] = code;
        code += count[i];
        code <<= 1;
    }
    /* Determine the code for each symbol. Mirrored, of course. */
    for (i = 0; i < nlengths; i++) {
        code = startcode[lengths[i]]++;
        codes[i] = 0;
        for (j = 0; j < lengths[i]; j++) {
            codes[i] = (codes[i] << 1) | (code & 1);
            code >>= 1;
        }
    }

    /*
     * Now we have the complete list of Huffman codes. Build a
     * table.
     */
    return zlib_mkonetab(codes, lengths, nlengths, 0, 0,
                         maxlen < 9 ? maxlen : 9);
}